

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::sync_refclocks
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vedge_t *vedge)

{
  pointer this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  type_conflict2 tVar1;
  clock_id_t cVar2;
  process_id_t pVar3;
  reference puVar4;
  element_type *this_01;
  const_reference pvVar5;
  undefined1 local_98 [24];
  undefined1 local_80 [4];
  edge_id_t id;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  vedge_t *__range2;
  allocator<unsigned_long> local_32;
  undefined1 local_31;
  pointer local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *procmap;
  vedge_t *vedge_local;
  reference_clock_variables_t *r_local;
  system_t *system_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *refclocks;
  
  procmap = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)vedge;
  vedge_local = (vedge_t *)r;
  r_local = (reference_clock_variables_t *)system;
  system_local = (system_t *)__return_storage_ptr__;
  local_30 = (pointer)reference_clock_variables_t::procmap(r);
  local_31 = 0;
  cVar2 = reference_clock_variables_t::refcount((reference_clock_variables_t *)vedge_local);
  std::allocator<unsigned_long>::allocator(&local_32);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)cVar2,0,&local_32);
  std::allocator<unsigned_long>::~allocator(&local_32);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (__return_storage_ptr__);
  this_00 = procmap;
  vedge_t::begin((const_iterator_t *)&__end2.m_end,(vedge_t *)procmap);
  vedge_t::end((const_iterator_t *)local_80,(vedge_t *)this_00);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long>
                             *)&__end2.m_end,
                            (iterator_facade<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long>
                             *)local_80), tVar1) {
    puVar4 = boost::iterators::detail::
             iterator_facade_base<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long,_false,_false>
                          *)&__end2.m_end);
    this = local_30;
    local_98._20_4_ = *puVar4;
    tchecker::system::edges_t::edge((edges_t *)local_98,(int)r_local + 0xb8);
    this_01 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_98);
    pVar3 = tchecker::system::edge_t::pid(this_01);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(ulong)pVar3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (__return_storage_ptr__,(ulong)*pvVar5,true);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_98);
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::filter_iterator<bool_(*)(unsigned_int),_const_unsigned_int_*>,_unsigned_int,_boost::iterators::bidirectional_traversal_tag,_const_unsigned_int_&,_long,_false,_false>
                  *)&__end2.m_end);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> sync_refclocks(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                       tchecker::vedge_t const & vedge)
{
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> refclocks{r.refcount()};
  refclocks.reset();
  for (tchecker::edge_id_t id : vedge)
    refclocks.set(procmap[system.edge(id)->pid()]);
  return refclocks;
}